

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O0

void __thiscall cpp_db::sqlite_result::move_next(sqlite_result *this)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  sqlite_exception *this_00;
  sqlite3 *db;
  sqlite_result *this_local;
  
  psVar2 = get_stmt_handle(this);
  iVar1 = sqlite3_step(psVar2);
  this->row_status = iVar1;
  if ((this->row_status != 0x65) && (this->row_status != 100)) {
    this_00 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    iVar1 = this->row_status;
    psVar2 = get_stmt_handle(this);
    db = (sqlite3 *)sqlite3_db_handle(psVar2);
    sqlite_exception::sqlite_exception(this_00,iVar1,db);
    __cxa_throw(this_00,&sqlite_exception::typeinfo,sqlite_exception::~sqlite_exception);
  }
  return;
}

Assistant:

void sqlite_result::move_next()
{
	row_status = sqlite3_step(get_stmt_handle());
    if (row_status != SQLITE_DONE && row_status != SQLITE_ROW)
        throw sqlite_exception(row_status, sqlite3_db_handle(get_stmt_handle()));
}